

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

void __thiscall despot::POMDPX::InitStates(POMDPX *this)

{
  void *pvVar1;
  pointer piVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  POMDPXState *pPVar6;
  pointer ppPVar7;
  log_ostream *plVar8;
  ostream *poVar9;
  pointer ppPVar10;
  ulong uVar11;
  timeval tv;
  vector<int,_std::allocator<int>_> local_48;
  double local_28;
  undefined4 extraout_var;
  
  if (this->is_small_ == false) {
    __assert_fail("is_small_",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                  ,0x126,"void despot::POMDPX::InitStates()");
  }
  gettimeofday((timeval *)&local_48,(__timezone_ptr_t)0x0);
  local_28 = (double)(long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
  dVar3 = (double)(long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
  iVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::resize
            (&this->states_,(long)iVar4);
  ppPVar7 = (this->states_).
            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar10 = (this->states_).
             super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar10 != ppPVar7) {
    uVar11 = 0;
    do {
      iVar4 = (*(this->super_MDP)._vptr_MDP[0x19])(0,this,uVar11 & 0xffffffff);
      pPVar6 = (POMDPXState *)CONCAT44(extraout_var,iVar4);
      Parser::ComputeState(&local_48,this->parser_,(int)uVar11);
      pvVar1 = (pPVar6->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (pPVar6->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (pPVar6->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (pPVar6->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      (pPVar6->vec_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,(long)piVar2 - (long)pvVar1);
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      (this->states_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = pPVar6;
      uVar11 = uVar11 + 1;
      ppPVar7 = (this->states_).
                super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppPVar10 = (this->states_).
                 super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppPVar10 - (long)ppPVar7 >> 3));
  }
  if (ppPVar10 != ppPVar7) {
    uVar11 = 0;
    do {
      uVar5 = (*(this->super_MDP)._vptr_MDP[9])(this,ppPVar7[uVar11]);
      if (uVar11 != uVar5) {
        __assert_fail("GetIndex(states_[s]) == s",
                      "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                      ,0x132,"void despot::POMDPX::InitStates()");
      }
      uVar11 = uVar11 + 1;
      ppPVar7 = (this->states_).
                super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(this->states_).
                                    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar7 >> 3)
            );
  }
  iVar4 = logging::level();
  if (0 < iVar4) {
    iVar4 = logging::level();
    if (2 < iVar4) {
      dVar3 = dVar3 / 1000000.0 + local_28;
      plVar8 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar8->super_ostream,"[POMDPX::InitState] Initialized state table in ",0x2f);
      gettimeofday((timeval *)&local_48,(__timezone_ptr_t)0x0);
      poVar9 = std::ostream::_M_insert<double>
                         (((double)(long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
                          (double)(long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) - dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"s",1);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void POMDPX::InitStates() {
	assert(is_small_);

	double start = get_time_second();
	states_.resize(NumStates());

	for (int s = 0; s < states_.size(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s, 0));
		state->vec_id = parser_->ComputeState(s);
		states_[s] = state;
	}

	for (int s = 0; s < states_.size(); s++)
		assert(GetIndex(states_[s]) == s);

	logi << "[POMDPX::InitState] Initialized state table in "
		<< (get_time_second() - start) << "s" << endl;
}